

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

void rtr_mgr_close_less_preferable_groups
               (rtr_socket *sock,rtr_mgr_config *config,rtr_mgr_group *group)

{
  long lVar1;
  rtr_mgr_group *group_00;
  long in_FS_OFFSET;
  uint local_44;
  uint j;
  rtr_mgr_group *current_group;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  rtr_mgr_group *group_local;
  rtr_mgr_config *config_local;
  rtr_socket *sock_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  for (group_node = (rtr_mgr_group_node *)tommy_list_head(&config->groups->list);
      group_node != (rtr_mgr_group_node *)0x0;
      group_node = (rtr_mgr_group_node *)(group_node->node).next) {
    group_00 = *(rtr_mgr_group **)((long)(group_node->node).data + 0x20);
    if (((group_00->status != RTR_MGR_CLOSED) && (group_00 != group)) &&
       (group->preference < group_00->preference)) {
      for (local_44 = 0; local_44 < group_00->sockets_len; local_44 = local_44 + 1) {
        rtr_stop(group_00->sockets[local_44]);
      }
      set_status(config,group_00,RTR_MGR_CLOSED,sock);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtr_mgr_close_less_preferable_groups(const struct rtr_socket *sock, struct rtr_mgr_config *config,
						 struct rtr_mgr_group *group)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;
		struct rtr_mgr_group *current_group = group_node->group;

		if ((current_group->status != RTR_MGR_CLOSED) && (current_group != group) &&
		    (current_group->preference > group->preference)) {
			for (unsigned int j = 0; j < current_group->sockets_len; j++)
				rtr_stop(current_group->sockets[j]);
			set_status(config, current_group, RTR_MGR_CLOSED, sock);
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
}